

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amalgamation_demo.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  uint32_t i;
  uint32_t val;
  long lVar2;
  Roaring r1;
  Roaring64Map r2;
  roaring_array_t local_88;
  Roaring64Map local_58;
  
  local_88.keys = (uint16_t *)0x0;
  local_88.typecodes = (uint8_t *)0x0;
  local_88.size = 0;
  local_88.allocation_size = 0;
  local_88.containers = (container_s **)0x0;
  local_88.flags = '\0';
  local_88._33_7_ = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_88,0);
  val = 100;
  do {
    roaring_bitmap_add((roaring_bitmap_t *)&local_88,val);
    val = val + 1;
  } while (val != 1000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cardinality = ",0xe);
  roaring_bitmap_get_cardinality((roaring_bitmap_t *)&local_88);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58.roarings._M_t._M_impl._0_8_ = 0;
  local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  lVar2 = 0;
  local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.copyOnWrite = false;
  local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    roaring::Roaring64Map::add(&local_58,lVar2 + 0xf9ccd8a1c5080064);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 900);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cardinality = ",0xe);
  roaring::Roaring64Map::cardinality(&local_58);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_58);
  roaring::Roaring::~Roaring((Roaring *)&local_88);
  return 0;
}

Assistant:

int main() {
  roaring::Roaring r1;
  for (uint32_t i = 100; i < 1000; i++) {
    r1.add(i);
  }
  std::cout << "cardinality = " << r1.cardinality() << std::endl;

  roaring::Roaring64Map r2;
  for (uint64_t i = 18000000000000000100ull; i < 18000000000000001000ull; i++) {
    r2.add(i);
  }
  std::cout << "cardinality = " << r2.cardinality() << std::endl;
  return 0;
}